

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

int __thiscall cppcms::http::details::async_io_buf::overflow(async_io_buf *this,int c)

{
  undefined1 *puVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  size_type __new_size;
  pointer pcVar5;
  
  if (this->full_buffering_ == true) {
    pcVar5 = *(pointer *)&(this->super_basic_device).super_extended_streambuf.field_0x28;
    if (pcVar5 == *(pointer *)&(this->super_basic_device).super_extended_streambuf.field_0x30) {
      pcVar2 = (this->super_basic_device).output_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pcVar3 = (this->super_basic_device).output_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __new_size = 0x40;
      if (pcVar2 != pcVar3) {
        __new_size = ((long)pcVar2 - (long)pcVar3) * 2;
      }
      iVar4 = *(int *)&(this->super_basic_device).super_extended_streambuf.field_0x20;
      std::vector<char,_std::allocator<char>_>::resize
                (&(this->super_basic_device).output_,__new_size);
      pcVar2 = (this->super_basic_device).output_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (this->super_basic_device).output_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)&(this->super_basic_device).super_extended_streambuf.field_0x20 = pcVar2;
      *(pointer *)&(this->super_basic_device).super_extended_streambuf.field_0x30 = pcVar3;
      pcVar5 = pcVar2 + ((int)pcVar5 - iVar4);
      *(pointer *)&(this->super_basic_device).super_extended_streambuf.field_0x28 = pcVar5;
    }
    if (c != -1) {
      *pcVar5 = (char)c;
      puVar1 = &(this->super_basic_device).super_extended_streambuf.field_0x28;
      *(long *)puVar1 = *(long *)puVar1 + 1;
    }
    return 0;
  }
  iVar4 = basic_device::overflow(&this->super_basic_device,c);
  return iVar4;
}

Assistant:

virtual int overflow(int c)
		{
			if(full_buffering_) {
				if(pptr() ==  epptr()) {
					size_t current_size = pptr() - pbase();
					output_.resize(next_size(output_.size()));
					setp(&output_[0],&output_[output_.size()-1]+1);
					pbump(current_size);
				}
				if(c!=EOF) {
					*pptr() = c;
					pbump(1);
				}
				return 0;
			}
			else {
				return basic_device::overflow(c);
			}
		}